

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::MatchRoutineEM64T<wchar_t>::MatchRoutineEM64T
          (MatchRoutineEM64T<wchar_t> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str,
          Logger *logger)

{
  CodeHolder *code;
  CodeHolder *this_00;
  Logger *logger_00;
  uint32_t instId;
  undefined8 in_stack_fffffffffffffd38;
  Label rejectlabel;
  MyConstPool pool;
  undefined1 local_180 [8];
  X86Assembler as;
  Logger *logger_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str_local;
  MatchRoutineEM64T<wchar_t> *this_local;
  uint32_t signature;
  
  this->_vptr_MatchRoutineEM64T = (_func_int **)&PTR__MatchRoutineEM64T_00295818;
  this_00 = (CodeHolder *)&this->m_runtime;
  as.super_Assembler._op5.field_0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)logger;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)this_00);
  logger_00 = (Logger *)&this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (as.super_Assembler._op5.field_0._mem.field_2 != 0) {
    asmjit::CodeHolder::setLogger((CodeHolder *)this,logger_00);
  }
  instId = (uint32_t)((ulong)logger_00 >> 0x20);
  code = (CodeHolder *)local_180;
  asmjit::X86Assembler::X86Assembler((X86Assembler *)this_00,code);
  emit_parser_prolog((X86Assembler *)code);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)this_00,(Operand_ *)code);
  MyConstPool::MyConstPool
            ((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
             (X86Assembler *)local_180);
  asmjit::Assembler::newLabel((Assembler *)in_stack_fffffffffffffd38);
  emit((X86Assembler *)local_180,
       (MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
       (Label *)&stack0xfffffffffffffd38,str);
  emit_parser_epilog((X86Assembler *)local_180,(Label *)&stack0xfffffffffffffd38);
  MyConstPool::embed((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8));
  asmjit::CodeEmitter::finalize((CodeEmitter *)local_180);
  MyConstPool::~MyConstPool
            ((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8));
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x183d0c);
  return;
}

Assistant:

MatchRoutineEM64T<TCHAR>::MatchRoutineEM64T(const std::basic_string<TCHAR>& str, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    asmjit::Label rejectlabel = as.newLabel();

    emit(as, pool, rejectlabel, str);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();
    
    as.finalize();
}